

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAppendSqlValue(JsonString *p,sqlite3_value *pValue)

{
  long lVar1;
  int iVar2;
  u32 N;
  uint uVar3;
  uchar *zIn;
  sqlite3_value *pVal;
  sqlite3_value *in_RSI;
  JsonString *in_RDI;
  long in_FS_OFFSET;
  u32 n_1;
  char *z_1;
  u32 n;
  char *z;
  JsonParse px;
  char *in_stack_ffffffffffffff68;
  JsonString *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  void *local_50;
  int local_48;
  JsonString *in_stack_ffffffffffffffd0;
  u32 in_stack_ffffffffffffffdc;
  JsonParse *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3_value_type(in_RSI);
  pVal = (sqlite3_value *)(ulong)(iVar2 - 1);
  switch(pVal) {
  case (sqlite3_value *)0x0:
    sqlite3_value_text((sqlite3_value *)0x23792a);
    sqlite3_value_bytes((sqlite3_value *)0x237939);
    jsonAppendRaw(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
    break;
  case (sqlite3_value *)0x1:
    sqlite3_value_double((sqlite3_value *)0x237903);
    jsonPrintf(100,in_RDI,"%!0.15g");
    break;
  case (sqlite3_value *)0x2:
    zIn = sqlite3_value_text((sqlite3_value *)0x23795f);
    N = sqlite3_value_bytes((sqlite3_value *)0x23796e);
    uVar3 = sqlite3_value_subtype(in_RSI);
    if (uVar3 == 0x4a) {
      jsonAppendRaw(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
    }
    else {
      jsonAppendString((JsonString *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (char *)zIn,N);
    }
    break;
  default:
    iVar2 = jsonFuncArgMightBeBinary
                      ((sqlite3_value *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (iVar2 == 0) {
      if (in_RDI->eErr == '\0') {
        sqlite3_result_error
                  ((sqlite3_context *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
        in_RDI->eErr = '\x04';
        jsonStringReset((JsonString *)0x237a4c);
      }
    }
    else {
      memset(&local_50,0xaa,0x48);
      memset(&local_50,0,0x48);
      local_50 = sqlite3_value_blob(pVal);
      local_48 = sqlite3_value_bytes((sqlite3_value *)0x2379fb);
      jsonTranslateBlobToText
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
    }
    break;
  case (sqlite3_value *)0x4:
    jsonAppendRawNZ(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonAppendSqlValue(
  JsonString *p,                 /* Append to this JSON string */
  sqlite3_value *pValue          /* Value to append */
){
  switch( sqlite3_value_type(pValue) ){
    case SQLITE_NULL: {
      jsonAppendRawNZ(p, "null", 4);
      break;
    }
    case SQLITE_FLOAT: {
      jsonPrintf(100, p, "%!0.15g", sqlite3_value_double(pValue));
      break;
    }
    case SQLITE_INTEGER: {
      const char *z = (const char*)sqlite3_value_text(pValue);
      u32 n = (u32)sqlite3_value_bytes(pValue);
      jsonAppendRaw(p, z, n);
      break;
    }
    case SQLITE_TEXT: {
      const char *z = (const char*)sqlite3_value_text(pValue);
      u32 n = (u32)sqlite3_value_bytes(pValue);
      if( sqlite3_value_subtype(pValue)==JSON_SUBTYPE ){
        jsonAppendRaw(p, z, n);
      }else{
        jsonAppendString(p, z, n);
      }
      break;
    }
    default: {
      if( jsonFuncArgMightBeBinary(pValue) ){
        JsonParse px;
        memset(&px, 0, sizeof(px));
        px.aBlob = (u8*)sqlite3_value_blob(pValue);
        px.nBlob = sqlite3_value_bytes(pValue);
        jsonTranslateBlobToText(&px, 0, p);
      }else if( p->eErr==0 ){
        sqlite3_result_error(p->pCtx, "JSON cannot hold BLOB values", -1);
        p->eErr = JSTRING_ERR;
        jsonStringReset(p);
      }
      break;
    }
  }
}